

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

int fctcl__is_option(fctcl_t *clo,char *option)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  
  if (clo == (fctcl_t *)0x0) {
    __assert_fail("clo != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x5f0
                  ,"int fctcl__is_option(const fctcl_t *, const char *)");
  }
  if (option == (char *)0x0) {
    return 0;
  }
  pcVar2 = clo->long_opt;
  if (pcVar2 != (char *)0x0) {
    if (pcVar2 == option) {
      return 1;
    }
    cVar3 = *pcVar2;
    if (cVar3 == *option) {
      lVar4 = 1;
      do {
        if (cVar3 == '\0') {
          return 1;
        }
        cVar3 = pcVar2[lVar4];
        pcVar1 = option + lVar4;
        lVar4 = lVar4 + 1;
      } while (cVar3 == *pcVar1);
    }
  }
  pcVar2 = clo->short_opt;
  if (pcVar2 != (char *)0x0) {
    if (pcVar2 != option) {
      cVar3 = *pcVar2;
      if (cVar3 != *option) {
        return 0;
      }
      lVar4 = 1;
      while (cVar3 != '\0') {
        cVar3 = pcVar2[lVar4];
        pcVar1 = option + lVar4;
        lVar4 = lVar4 + 1;
        if (cVar3 != *pcVar1) {
          return 0;
        }
      }
    }
    return 1;
  }
  return 0;
}

Assistant:

static int
fctcl__is_option(fctcl_t const *clo, char const *option)
{
    FCT_ASSERT( clo != NULL );
    if ( option == NULL )
    {
        return 0;
    }
    return ((clo->long_opt != NULL
             && fctstr_eq(clo->long_opt, option))
            ||
            (clo->short_opt != NULL
             && fctstr_eq(clo->short_opt, option))
           );
}